

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int google::protobuf::io::CodedOutputStream::VarintSize64(uint64 value)

{
  int iVar1;
  
  if (value >> 0x23 == 0) {
    if (value < 0x80) {
      iVar1 = 1;
    }
    else if (value < 0x4000) {
      iVar1 = 2;
    }
    else {
      if (0x1fffff < value) {
        return 5 - (uint)(value < 0x10000000);
      }
      iVar1 = 3;
    }
  }
  else if (value >> 0x2a == 0) {
    iVar1 = 6;
  }
  else if (value >> 0x31 == 0) {
    iVar1 = 7;
  }
  else {
    if (value >> 0x38 != 0) {
      return ((long)value < 0) + 9;
    }
    iVar1 = 8;
  }
  return iVar1;
}

Assistant:

int CodedOutputStream::VarintSize64(uint64 value) {
  if (value < (1ull << 35)) {
    if (value < (1ull << 7)) {
      return 1;
    } else if (value < (1ull << 14)) {
      return 2;
    } else if (value < (1ull << 21)) {
      return 3;
    } else if (value < (1ull << 28)) {
      return 4;
    } else {
      return 5;
    }
  } else {
    if (value < (1ull << 42)) {
      return 6;
    } else if (value < (1ull << 49)) {
      return 7;
    } else if (value < (1ull << 56)) {
      return 8;
    } else if (value < (1ull << 63)) {
      return 9;
    } else {
      return 10;
    }
  }
}